

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O2

bool __thiscall OpenMD::ZConstraintForceModifier::haveMovingZMols(ZConstraintForceModifier *this)

{
  return (this->movingZMols_).
         super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&this->movingZMols_;
}

Assistant:

bool ZConstraintForceModifier::haveMovingZMols() {
    int haveMoving = movingZMols_.empty() ? 0 : 1;

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &haveMoving, 1, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    return haveMoving > 0;
  }